

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O2

bool __thiscall Jinx::Impl::Parser::ParseStatement(Parser *this)

{
  VariableStackFrame *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  VisibilityType scope;
  uint32_t uVar4;
  RuntimeID val;
  mapped_type *this_01;
  size_t sVar5;
  size_t address;
  char *pcVar6;
  byte bVar7;
  byte bVar8;
  initializer_list<Jinx::Impl::SymbolType> symbols;
  char *local_a8;
  PropertyName propertyName;
  FunctionMatch functionMatch;
  
  if (this->m_error != false) {
    return false;
  }
  CheckFunctionCall(&functionMatch,this);
  if (functionMatch.signature != (FunctionSignature *)0x0) {
    ParseFunctionCall(this,&functionMatch);
    EmitOpcode(this,Pop);
    bVar1 = false;
    Expect(this,NewLine,(char *)0x0);
    goto LAB_0011e95f;
  }
  bVar1 = Accept(this,Set);
  scope = ParseScope(this);
  bVar2 = Accept(this,Readonly);
  if (bVar2 && scope == Local) {
    pcVar6 = "The \'readonly\' keyword must follow a private or public keyword";
LAB_0011e8bd:
    Error<>(this,pcVar6);
LAB_0011e8c5:
    bVar7 = 0;
LAB_0011e959:
    bVar8 = 0;
  }
  else {
    bVar3 = Accept(this,Function);
    if (bVar3) {
      ParseFunctionDefinition(this,scope);
LAB_0011e956:
      bVar7 = 1;
      goto LAB_0011e959;
    }
    if ((bVar1) && (bVar1 = CheckName(this), bVar1)) {
      bVar1 = std::operator==(&((this->m_currentSymbol)._M_current)->text,
                              &((this->m_library).
                                super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->m_name);
      if (bVar1) {
        pcVar6 = "Illegal use of library name in identifier";
        goto LAB_0011e8bd;
      }
      if (scope == Local) {
        bVar1 = CheckProperty(this,(size_t *)0x0);
        if (bVar1) {
          ParsePropertyName(&propertyName,this);
          if (propertyName.m_readOnly == true) {
            Error<>(this,"Can\'t change readonly property");
          }
          else {
            uVar4 = ParseSubscriptSet(this);
            Expect(this,To,(char *)0x0);
            ParseExpression(this);
            Expect(this,NewLine,(char *)0x0);
            if (uVar4 == 0) {
              EmitOpcode(this,SetProp);
            }
            else {
              EmitOpcode(this,SetPropKeyVal);
              BinaryWriter::Write(&this->m_writer,uVar4);
            }
            BinaryWriter::Write(&this->m_writer,propertyName.m_id);
            local_a8 = (char *)propertyName.m_id;
            this_01 = std::
                      map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_8192UL,_16UL>_>
                      ::operator[](&this->m_idNameMap,(key_type *)&local_a8);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
            _M_assign(this_01,&propertyName.m_name);
          }
          PropertyName::~PropertyName(&propertyName);
          bVar7 = propertyName.m_readOnly ^ 1;
          goto LAB_0011e959;
        }
        local_a8 = (char *)0x140000003f;
        symbols._M_len = 2;
        symbols._M_array = (iterator)&local_a8;
        ParseMultiName_abi_cxx11_((String *)&propertyName,this,symbols);
        uVar4 = ParseSubscriptSet(this);
        Expect(this,To,(char *)0x0);
        ParseExpression(this);
        Expect(this,NewLine,"Unable to parse expression");
        VariableAssign(this,(String *)&propertyName);
        if (uVar4 == 0) {
          EmitOpcode(this,SetVar);
        }
        else {
          EmitOpcode(this,SetVarKeyVal);
          BinaryWriter::Write(&this->m_writer,uVar4);
        }
        val = VariableNameToRuntimeID(this,(String *)&propertyName);
        BinaryWriter::Write(&this->m_writer,val);
LAB_0011eb9c:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
        ~basic_string((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                      &propertyName);
      }
      else {
        ParsePropertyDeclaration(this,scope,bVar2);
      }
      goto LAB_0011e956;
    }
    if (scope != Local) {
      pcVar6 = "private";
      if (scope == Public) {
        pcVar6 = "public";
      }
      propertyName.m_id = (RuntimeID)pcVar6;
      Error<char_const*>(this,"Invalid symbol after scope specifier \'%s\'",(char **)&propertyName);
      goto LAB_0011e956;
    }
    bVar1 = Accept(this,Begin);
    if (!bVar1) {
      bVar1 = Accept(this,If);
      if (bVar1) {
        ParseIfElse(this);
      }
      else {
        bVar1 = Accept(this,Loop);
        if (bVar1) {
          ParseLoop(this);
        }
        else {
          bVar1 = Accept(this,Erase);
          if (bVar1) {
            ParseErase(this);
          }
          else {
            bVar1 = Check(this,Increment);
            if ((bVar1) || (bVar1 = Check(this,Decrement), bVar1)) {
              ParseIncDec(this);
            }
            else {
              bVar1 = Accept(this,Return);
              if (bVar1) {
                bVar1 = VariableStackFrame::IsRootFrame(&this->m_variableStackFrame);
                bVar2 = Check(this,NewLine);
                if (bVar1) {
                  if (!bVar2) {
                    LogWriteLine(Warning,"Return values at root scope do nothing");
                    ParseExpression(this);
                  }
                  EmitOpcode(this,Exit);
                }
                else {
                  if (bVar2) {
                    EmitOpcode(this,PushVal);
                    propertyName.m_id = propertyName.m_id & 0xffffffff00000000;
                    Variant::SetNull((Variant *)&propertyName);
                    Variant::Write((Variant *)&propertyName,&this->m_writer);
                    Variant::~Variant((Variant *)&propertyName);
                  }
                  else {
                    ParseExpression(this);
                  }
                  EmitOpcode(this,Return);
                }
                Accept(this,NewLine);
                bVar7 = 1;
                bVar8 = 1;
                goto LAB_0011e95c;
              }
              bVar1 = Accept(this,Break);
              if (bVar1) {
                Expect(this,NewLine,(char *)0x0);
                EmitOpcode(this,Jump);
                sVar5 = EmitAddressPlaceholder(this);
                this->m_breakAddress = sVar5;
              }
              else {
                bVar1 = Accept(this,Wait);
                if (bVar1) {
                  bVar1 = Accept(this,NewLine);
                  if (bVar1) {
                    EmitOpcode(this,Wait);
                  }
                  else {
                    bVar1 = Check(this,Until);
                    if ((!bVar1) && (bVar1 = Check(this,While), !bVar1)) {
                      pcVar6 = "Unexpected symbol after wait";
                      goto LAB_0011ee76;
                    }
                    sVar5 = (this->m_writer).m_pos;
                    bVar1 = Accept(this,Until);
                    if (!bVar1) {
                      Expect(this,While,(char *)0x0);
                    }
                    ParseExpression(this);
                    bVar2 = Expect(this,NewLine,(char *)0x0);
                    if (!bVar2) goto LAB_0011e8c5;
                    EmitOpcode(this,(uint)bVar1 * 2 + JumpFalse);
                    address = EmitAddressPlaceholder(this);
                    EmitOpcode(this,Wait);
                    EmitOpcode(this,Jump);
                    BinaryWriter::Write(&this->m_writer,(uint32_t)sVar5);
                    EmitAddressBackfill(this,address);
                  }
                }
                else {
                  bVar1 = Accept(this,External);
                  if (bVar1) {
                    bVar1 = CheckProperty(this,(size_t *)0x0);
                    ParseMultiName_abi_cxx11_
                              ((String *)&propertyName,this,
                               (initializer_list<Jinx::Impl::SymbolType>)ZEXT816(0));
                    this_00 = &this->m_variableStackFrame;
                    bVar2 = VariableStackFrame::IsRootFrame(this_00);
                    if (bVar2) {
                      bVar2 = VariableStackFrame::IsRootScope(this_00);
                      if (bVar2) {
                        if (bVar1) {
                          local_a8 = (char *)propertyName.m_id;
                          Error<char_const*>(this,
                                             "External variable \'%s\' is already a property name",
                                             &local_a8);
                        }
                        else {
                          bVar1 = VariableStackFrame::VariableExists
                                            (this_00,(String *)&propertyName);
                          if (bVar1) {
                            local_a8 = (char *)propertyName.m_id;
                            Error<char_const*>(this,"Variable \'%s\' already exists",&local_a8);
                          }
                          else {
                            bVar1 = VariableStackFrame::VariableAssign
                                              (this_00,(String *)&propertyName);
                            if (!bVar1) {
                              local_a8 = (char *)propertyName.m_id;
                              Error<char_const*>(this,"Error creating external variable \'%s\'",
                                                 &local_a8);
                            }
                          }
                        }
                      }
                      else {
                        local_a8 = (char *)propertyName.m_id;
                        Error<char_const*>(this,
                                           "External variable \'%s\' must be declared at the root scope"
                                           ,&local_a8);
                      }
                    }
                    else {
                      local_a8 = (char *)propertyName.m_id;
                      Error<char_const*>(this,
                                         "External variable \'%s\' can\'t be declared in a function"
                                         ,&local_a8);
                    }
                    Expect(this,NewLine,(char *)0x0);
                    goto LAB_0011eb9c;
                  }
                  pcVar6 = "Unknown symbol in statement";
LAB_0011ee76:
                  Error<>(this,pcVar6);
                }
              }
            }
          }
        }
      }
      goto LAB_0011e956;
    }
    Expect(this,NewLine,(char *)0x0);
    ParseBlock(this);
    Expect(this,End,(char *)0x0);
    bVar8 = 0;
    Expect(this,NewLine,(char *)0x0);
    bVar7 = 1;
  }
LAB_0011e95c:
  bVar1 = (bool)(bVar7 & bVar8);
LAB_0011e95f:
  std::
  _Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
  ::~_Vector_base(&functionMatch.partData.
                   super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                 );
  return bVar1;
}

Assistant:

inline_t bool Parser::ParseStatement()
	{
		// No need to continue if an error has been flagged
		if (m_error)
			return false;

		bool returnedValue = false;

		// Functions signatures have precedence over everything, so check for a 
		// potential signature match before anything else.
		const auto functionMatch = CheckFunctionCall();
		if (functionMatch.signature)
		{
			// We found a valid function signature that matches the current token(s)
			ParseFunctionCall(functionMatch);

			// Since all functions return a value, we need to discard the return
			// value not on the stack, since we're not assigning it to a variable.
			EmitOpcode(Opcode::Pop);
			Expect(SymbolType::NewLine);
		}
		else
		{
			bool set = Accept(SymbolType::Set);

			// Parse scope level
			VisibilityType scope = ParseScope();

			// Parse optional readonly, which can only apply to properties
			bool readOnly = Accept(SymbolType::Readonly);
			if (readOnly)
			{
				if (scope == VisibilityType::Local)
				{
					Error("The 'readonly' keyword must follow a private or public keyword");
					return false;
				}
			}

			if (Accept(SymbolType::Function))
			{
				// We're parsing a function definition
				ParseFunctionDefinition(scope);
			}
			else if (set && CheckName())
			{
				// Can't use the current library name or preface the variable with it
				if (m_currentSymbol->text == m_library->GetName())
				{
					Error("Illegal use of library name in identifier");
					return false;
				}

				// We're declaring a new property if we see a non-local scope declaration
				if (scope != VisibilityType::Local)
				{
					ParsePropertyDeclaration(scope, readOnly);
				}
				// Either this is an existing property or a variable
				else
				{
					// Check to see if this is an existing property
					if (CheckProperty())
					{
						// Get the property name
						auto propertyName = ParsePropertyName();

						// Make sure we're not trying to assign a value to a readonly property
						if (propertyName.IsReadOnly())
						{
							Error("Can't change readonly property");
							return false;
						}

						// Check for subscript operators
						uint32_t subscripts = ParseSubscriptSet();

						// Check for a 'to' statement
						Expect(SymbolType::To);

						// Parse expression
						ParseExpression();
						Expect(SymbolType::NewLine);

						// Assign property
						if (subscripts)
						{
							EmitOpcode(Opcode::SetPropKeyVal);
							EmitCount(subscripts);
						}
						else
							EmitOpcode(Opcode::SetProp);

						EmitId(propertyName.GetId());
						m_idNameMap[propertyName.GetId()] = propertyName.GetName();
					}
					// Otherwise we're just dealing with an ordinary variable
					else
					{
						// Get the variable name
						String name = ParseMultiName({ SymbolType::To, SymbolType::SquareOpen });

						// Check for subscript operator
						uint32_t subscripts = ParseSubscriptSet();

						// Check for a 'to' statement
						Expect(SymbolType::To);

						// Parse expression
						ParseExpression();
						Expect(SymbolType::NewLine, "Unable to parse expression");

						// Add to variable table
						VariableAssign(name);

						// Assign a variable. 
						if (subscripts)
						{
							EmitOpcode(Opcode::SetVarKeyVal);
							EmitCount(subscripts);
						}
						else
							EmitOpcode(Opcode::SetVar);
						EmitId(VariableNameToRuntimeID(name));
					}
				}
			}
			else if (scope == VisibilityType::Local)
			{
				if (Accept(SymbolType::Begin))
				{
					// We're parsing a begin/end block
					Expect(SymbolType::NewLine);
					ParseBlock();
					Expect(SymbolType::End);
					Expect(SymbolType::NewLine);
				}
				else if (Accept(SymbolType::If))
				{
					// We're parsing an if or if/else block
					ParseIfElse();
				}
				else if (Accept(SymbolType::Loop))
				{
					// We're parsing a loop block
					ParseLoop();
				}
				else if (Accept(SymbolType::Erase))
				{
					// We're parsing an erase operation
					ParseErase();
				}
				else if (Check(SymbolType::Increment) || Check(SymbolType::Decrement))
				{
					// We're parsing an increment or decrement statement
					ParseIncDec();
				}
				else if (Accept(SymbolType::Return))
				{
					// We've hit a return value.  There are different behaviors depending whether or
					// not we're at the base scope or not.
					if (m_variableStackFrame.IsRootFrame())
					{
						if (!Check(SymbolType::NewLine))
						{
							LogWriteLine(LogLevel::Warning, "Return values at root scope do nothing");
							ParseExpression();
						}
						EmitOpcode(Opcode::Exit);
						Accept(SymbolType::NewLine);
						returnedValue = true;
					}
					else
					{
						if (!Check(SymbolType::NewLine))
						{
							ParseExpression();
						}
						else
						{
							EmitOpcode(Opcode::PushVal);
							EmitValue(nullptr);
						}
						EmitOpcode(Opcode::Return);
						Accept(SymbolType::NewLine);
						returnedValue = true;
					}
				}
				else if (Accept(SymbolType::Break))
				{
					// We've hit a break statement
					Expect(SymbolType::NewLine);
					EmitOpcode(Opcode::Jump);
					m_breakAddress = EmitAddressPlaceholder();
				}
				else if (Accept(SymbolType::Wait))
				{
					// Check for basic wait statement
					if (Accept(SymbolType::NewLine))
						EmitOpcode(Opcode::Wait);
					else if (Check(SymbolType::Until) || Check(SymbolType::While))
					{
						// Store expression address
						auto expressionAddress = m_writer.Tell();

						// Check which keyword was used
						bool jumpTrue = Accept(SymbolType::Until);
						if (!jumpTrue)
							Expect(SymbolType::While);

						// Parse the expression to check for wait
						ParseExpression();
						if (!Expect(SymbolType::NewLine))
							return false;

						// Add jump if false/true over wait statement depending on keyword
						EmitOpcode(jumpTrue ? Opcode::JumpTrue : Opcode::JumpFalse);

						// Mark placeholder for later jump address insertion
						auto addressPlaceholder = EmitAddressPlaceholder();

						// Wait statement is executed if expression is true
						EmitOpcode(Opcode::Wait);
						EmitOpcode(Opcode::Jump);
						EmitAddress(expressionAddress);

						// Backfill placeholder at end of conditional wait statement
						EmitAddressBackfill(addressPlaceholder);
					}
					else
					{
						Error("Unexpected symbol after wait");
					}
				}
				else if (Accept(SymbolType::External))
				{
					// First check to see if this collides with an existing property name
					bool propExists = CheckProperty();

					// Get the variable name
					String name = ParseMultiName({ });

					// Validate the name is legal and register it as a variable name
					if (!m_variableStackFrame.IsRootFrame())
						Error("External variable '%s' can't be declared in a function", name.c_str());
					else if (!m_variableStackFrame.IsRootScope())
						Error("External variable '%s' must be declared at the root scope", name.c_str());
					else if (propExists)
						Error("External variable '%s' is already a property name", name.c_str());
					else if (m_variableStackFrame.VariableExists(name))
						Error("Variable '%s' already exists", name.c_str());
					else if (!m_variableStackFrame.VariableAssign(name))
						Error("Error creating external variable '%s'", name.c_str());

					Expect(SymbolType::NewLine);
				}
				else
				{
					Error("Unknown symbol in statement");
				}
			}
			else
			{
				Error("Invalid symbol after scope specifier '%s'", scope == VisibilityType::Public ? "public" : "private");
			}
		}

		// This is not an error value, but signals whether we've returned a value from this statement
		return returnedValue;
	}